

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O2

void __thiscall amrex::FABio_8bit::skip(FABio_8bit *this,istream *is,FArrayBox *f)

{
  int iVar1;
  Long LVar2;
  istream *piVar3;
  int k;
  int iVar4;
  int nbytes;
  Real mx;
  Real mn;
  
  LVar2 = Box::numPts(&(f->super_BaseFab<double>).domain);
  for (iVar4 = 0; iVar4 < (f->super_BaseFab<double>).nvar; iVar4 = iVar4 + 1) {
    piVar3 = std::istream::_M_extract<double>((double *)is);
    piVar3 = std::istream::_M_extract<double>((double *)piVar3);
    std::istream::operator>>((istream *)piVar3,&nbytes);
    do {
      iVar1 = std::istream::get();
    } while (iVar1 != 10);
    std::istream::seekg((long)is,(_Ios_Seekdir)LVar2);
  }
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
    Error_host("FABio_8bit::skip() failed");
  }
  return;
}

Assistant:

void
FABio_8bit::skip (std::istream& is,
                  FArrayBox&    f) const
{
    const Box& bx = f.box();
    Long siz      = bx.numPts();
    Real mn, mx;
    for(int nbytes, k = 0; k < f.nComp(); ++k) {
        is >> mn >> mx >> nbytes;
        BL_ASSERT(nbytes == siz);
        while(is.get() != '\n') {
            ;  // ---- do nothing
        }
        is.seekg(siz, std::ios::cur);
    }

    if(is.fail()) {
        amrex::Error("FABio_8bit::skip() failed");
    }
}